

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objectivec_helpers.cc
# Opt level: O0

void google::protobuf::compiler::objectivec::StringPieceTrimWhitespace(StringPiece *input)

{
  bool bVar1;
  char c;
  char *pcVar2;
  stringpiece_ssize_type sVar3;
  undefined1 local_12;
  undefined1 local_11;
  StringPiece *input_local;
  
  while( true ) {
    bVar1 = StringPiece::empty(input);
    local_11 = false;
    if (!bVar1) {
      pcVar2 = StringPiece::data(input);
      local_11 = ascii_isspace(*pcVar2);
    }
    if (local_11 == false) break;
    StringPiece::remove_prefix(input,1);
  }
  while( true ) {
    bVar1 = StringPiece::empty(input);
    local_12 = false;
    if (!bVar1) {
      sVar3 = StringPiece::length(input);
      c = StringPiece::operator[](input,sVar3 + -1);
      local_12 = ascii_isspace(c);
    }
    if (local_12 == false) break;
    StringPiece::remove_suffix(input,1);
  }
  return;
}

Assistant:

void StringPieceTrimWhitespace(StringPiece* input) {
  while (!input->empty() && ascii_isspace(*input->data())) {
    input->remove_prefix(1);
  }
  while (!input->empty() && ascii_isspace((*input)[input->length() - 1])) {
    input->remove_suffix(1);
  }
}